

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults> * __thiscall
kj::_::
convertToReturn<capnp::Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults>>
          (Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults>
           *__return_storage_ptr__,_ *this,
          ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults>_>
          *result)

{
  Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults> *pRVar1;
  Exception *pEVar2;
  Exception *exception_1;
  Exception *_exception92;
  Exception *exception;
  Exception *_exception88;
  Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults> *value;
  Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults> *_value87;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults>_>
  *result_local;
  
  pRVar1 = readMaybe<capnp::Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults>>
                     ((Maybe<capnp::Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults>_>
                       *)(this + 0x198));
  if (pRVar1 != (Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults> *)0x0) {
    pEVar2 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)this);
    if (pEVar2 != (Exception *)0x0) {
      pEVar2 = mv<kj::Exception>(pEVar2);
      throwRecoverableException(pEVar2,0);
    }
    pRVar1 = mv<capnp::Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults>>
                       (pRVar1);
    pRVar1 = returnMaybeVoid<capnp::Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults>>
                       (pRVar1);
    ::capnp::Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults>::Response
              (__return_storage_ptr__,pRVar1);
    return __return_storage_ptr__;
  }
  pEVar2 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)this);
  if (pEVar2 != (Exception *)0x0) {
    pEVar2 = mv<kj::Exception>(pEVar2);
    throwFatalException(pEVar2,0);
  }
  unreachable();
}

Assistant:

inline T convertToReturn(ExceptionOr<T>&& result) {
  KJ_IF_SOME(value, result.value) {
    KJ_IF_SOME(exception, result.exception) {
      throwRecoverableException(kj::mv(exception));
    }
    return _::returnMaybeVoid(kj::mv(value));
  } else KJ_IF_SOME(exception, result.exception) {
    throwFatalException(kj::mv(exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }